

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O2

void __thiscall
gnns::Knn_Graph<L2Distance<float>_>::load_graph
          (Knn_Graph<L2Distance<float>_> *this,string *graph_index_path,string *graph_dist_path)

{
  size_t_conflict sVar1;
  GnnsException *this_00;
  size_t_conflict local_28;
  size_t_conflict sStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  load_from_file<unsigned_int>((gnns *)&local_28,graph_index_path);
  (this->indices).cols = local_28;
  (this->indices).rows = sStack_24;
  (this->indices).data = (uint *)CONCAT44(uStack_1c,uStack_20);
  load_from_file<float>((gnns *)&local_28,graph_dist_path);
  (this->distances).cols = local_28;
  (this->distances).rows = sStack_24;
  *(undefined4 *)&(this->distances).data = uStack_20;
  *(undefined4 *)((long)&(this->distances).data + 4) = uStack_1c;
  if (((this->indices).rows == (this->distances).rows) &&
     (sVar1 = (this->indices).cols, sVar1 == (this->distances).cols)) {
    this->k = sVar1;
    return;
  }
  this_00 = (GnnsException *)__cxa_allocate_exception(0x10);
  GnnsException::GnnsException(this_00,"Saved graph file error\n");
  __cxa_throw(this_00,&GnnsException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_graph(const std::string& graph_index_path, const std::string& graph_dist_path)
        {
            try{
                indices = load_from_file<IndexType>(graph_index_path);
                distances = load_from_file<DistanceType>(graph_dist_path);
                if(indices.rows != distances.rows || indices.cols != distances.cols)
                {
                    throw GnnsException("Saved graph file error\n");
                }
                k = indices.cols;
            }catch (std::exception& e){
                throw e;
            }
        }